

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Object * __thiscall json::Object::add<json::Object,json::Object>(Object *this,string *key,Object *v)

{
  Object *this_00;
  runtime_error *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_bool>
  pVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::Object_*>
  pStack_58;
  
  this_00 = (Object *)operator_new(0x38);
  Object(this_00,v);
  std::__cxx11::string::string((string *)&pStack_58,(string *)key);
  pStack_58.second = this_00;
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>,std::_Select1st<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,json::Object*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>,std::_Select1st<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
                      *)&this->fields,&pStack_58);
  std::__cxx11::string::~string((string *)&pStack_58);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"can\'t insert field");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object& add(std::string const& key, V const& v) {
            json_assert(fields.insert(std::make_pair(key, new T(v))).second, "can't insert field");
            return *this;
        }